

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input_buffer.cc
# Opt level: O0

void __thiscall
dtc::anon_unknown_1::binary_operator<8,_std::less<unsigned_long_long>_>::dump_impl
          (binary_operator<8,_std::less<unsigned_long_long>_> *this)

{
  pointer peVar1;
  binary_operator<8,_std::less<unsigned_long_long>_> *this_local;
  
  peVar1 = std::
           unique_ptr<dtc::(anonymous_namespace)::expression,_std::default_delete<dtc::(anonymous_namespace)::expression>_>
           ::operator->(&(this->super_binary_operator_base).lhs);
  expression::dump(peVar1,false);
  std::operator<<((ostream *)&std::cerr,this->opName);
  peVar1 = std::
           unique_ptr<dtc::(anonymous_namespace)::expression,_std::default_delete<dtc::(anonymous_namespace)::expression>_>
           ::operator->(&(this->super_binary_operator_base).rhs);
  expression::dump(peVar1,false);
  return;
}

Assistant:

void dump_impl() override
	{
		lhs->dump();
		std::cerr << opName;
		rhs->dump();
	}